

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

type_info * pybind11::detail::get_type_info(type_index *tp,bool throw_if_missing)

{
  int iVar1;
  iterator iVar2;
  internals *this;
  type_info *ptVar3;
  long *plVar4;
  size_type *psVar5;
  string tname;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (registered_local_types_cpp()::locals == '\0') {
    iVar1 = __cxa_guard_acquire(&registered_local_types_cpp()::locals);
    if (iVar1 != 0) {
      registered_local_types_cpp()::locals._0_8_ = 0x121700;
      registered_local_types_cpp()::locals._8_8_ = 1;
      registered_local_types_cpp()::locals._16_8_ = 0;
      registered_local_types_cpp()::locals._24_8_ = 0;
      registered_local_types_cpp()::locals._32_8_ = 0x3f800000;
      registered_local_types_cpp()::locals._40_8_ = 0;
      registered_local_types_cpp()::locals._48_8_ = 0;
      __cxa_atexit(std::
                   unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
                   ::~unordered_map,registered_local_types_cpp()::locals,&__dso_handle);
      __cxa_guard_release(&registered_local_types_cpp()::locals);
    }
  }
  iVar2 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)registered_local_types_cpp()::locals,tp);
  if ((iVar2.
       super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (ptVar3 = *(type_info **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                       ._M_cur + 0x10), ptVar3 == (type_info *)0x0)) {
    this = get_internals();
    iVar2 = std::
            _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this,tp);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
        ._M_cur == (__node_type *)0x0) {
      ptVar3 = (type_info *)0x0;
    }
    else {
      ptVar3 = *(type_info **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                       ._M_cur + 0x10);
    }
    if (throw_if_missing && ptVar3 == (type_info *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,
                 *(char **)(tp->_M_target + 8) + (**(char **)(tp->_M_target + 8) == '*'),
                 (allocator<char> *)&local_78);
      clean_type_id(&local_38);
      std::operator+(&local_58,"pybind11::detail::get_type_info: unable to find type info for \"",
                     &local_38);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_58);
      local_78._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_78._M_dataplus._M_p == psVar5) {
        local_78.field_2._M_allocated_capacity = *psVar5;
        local_78.field_2._8_8_ = plVar4[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar5;
      }
      local_78._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      pybind11_fail(&local_78);
    }
  }
  return ptVar3;
}

Assistant:

PYBIND11_NOINLINE inline detail::type_info *get_type_info(const std::type_index &tp,
                                                          bool throw_if_missing = false) {
    if (auto ltype = get_local_type_info(tp))
        return ltype;
    if (auto gtype = get_global_type_info(tp))
        return gtype;

    if (throw_if_missing) {
        std::string tname = tp.name();
        detail::clean_type_id(tname);
        pybind11_fail("pybind11::detail::get_type_info: unable to find type info for \"" + tname + "\"");
    }
    return nullptr;
}